

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QtPrivate::QCalendarView::mouseMoveEvent(QCalendarView *this,QMouseEvent *event)

{
  long lVar1;
  QDate date;
  QCalendarModel *this_00;
  QItemSelectionModel *pQVar2;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  int col;
  int row;
  undefined1 local_50 [24];
  int local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)this);
  lVar1 = QMetaObject::cast((QObject *)&QCalendarModel::staticMetaObject);
  if (lVar1 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QAbstractItemView::mouseMoveEvent((QAbstractItemView *)this,event);
      return;
    }
  }
  else {
    if (this->readOnly == false) {
      if (this->validDateClicked == true) {
        date = handleMouseEvent(this,event);
        if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
          local_34 = -1;
          local_38 = -1;
          this_00 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
          QCalendarModel::cellForDate(this_00,date,&local_34,&local_38);
          if ((local_34 != -1) && (local_38 != -1)) {
            pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
            pQVar3 = QAbstractItemView::model((QAbstractItemView *)this);
            (**(code **)(*(long *)pQVar3 + 0x60))(local_50,pQVar3,local_34,local_38);
            (**(code **)(*(long *)pQVar2 + 0x60))(pQVar2,local_50,0);
          }
        }
      }
      else {
        event[0xc] = (QMouseEvent)0x0;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarView::mouseMoveEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseMoveEvent(event);
        return;
    }

    if (readOnly)
        return;

    if (validDateClicked) {
       QDate date = handleMouseEvent(event);
        if (date.isValid()) {
            int row = -1, col = -1;
            static_cast<QCalendarModel *>(model())->cellForDate(date, &row, &col);
            if (row != -1 && col != -1) {
                selectionModel()->setCurrentIndex(model()->index(row, col), QItemSelectionModel::NoUpdate);
            }
        }
    } else {
        event->ignore();
    }
}